

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O2

size_t __thiscall
frozen::bits::pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>::
lookup<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
          (pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *hasher)

{
  size_t sVar1;
  string_view value;
  string_view value_00;
  
  value._M_str = (key->_M_dataplus)._M_p;
  value._M_len = key->_M_string_length;
  sVar1 = elsa<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    (hasher,value,*(size_t *)this);
  sVar1 = *(size_t *)(this + (ulong)((uint)sVar1 & 0x3f) * 8 + 8);
  if ((long)sVar1 < 0) {
    value_00._M_str = (key->_M_dataplus)._M_p;
    value_00._M_len = key->_M_string_length;
    sVar1 = elsa<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                      (hasher,value_00,sVar1);
    sVar1 = *(size_t *)(this + (ulong)((uint)sVar1 & 0x3f) * 8 + 0x208);
  }
  return sVar1;
}

Assistant:

constexpr std::size_t lookup(const KeyType & key, const HasherType& hasher) const {
    auto const d = first_table_[hasher(key, static_cast<size_t>(first_seed_)) % M];
    if (!d.is_seed()) { return static_cast<std::size_t>(d.value()); } // this is narrowing uint64 -> size_t but should be fine
    else { return second_table_[hasher(key, static_cast<std::size_t>(d.value())) % M]; }
  }